

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.c
# Opt level: O2

void av1_alloc_src_diff_buf(AV1Common *cm,macroblock *mb)

{
  void *pvVar1;
  byte bVar2;
  long lVar3;
  long lVar4;
  
  lVar4 = 0x88;
  if (cm->seq_params->monochrome == '\0') {
    lVar4 = 0x198;
  }
  for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 0x88) {
    if (lVar3 == 0) {
      bVar2 = 0;
    }
    else {
      bVar2 = (char)cm->seq_params->subsampling_y + (char)cm->seq_params->subsampling_x;
    }
    pvVar1 = aom_memalign(0x20,(ulong)((0x4000U >> (bVar2 & 0x1f)) * 2));
    *(void **)((long)&mb->plane[0].src_diff + lVar3) = pvVar1;
    if (pvVar1 == (void *)0x0) {
      aom_internal_error(cm->error,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate mb->plane[plane].src_diff");
    }
  }
  return;
}

Assistant:

void av1_alloc_src_diff_buf(const struct AV1Common *cm, struct macroblock *mb) {
  const int num_planes = av1_num_planes(cm);
#ifndef NDEBUG
  for (int plane = 0; plane < num_planes; ++plane) {
    assert(!mb->plane[plane].src_diff);
  }
#endif
  for (int plane = 0; plane < num_planes; ++plane) {
    const int subsampling_xy =
        plane ? cm->seq_params->subsampling_x + cm->seq_params->subsampling_y
              : 0;
    const int sb_size = MAX_SB_SQUARE >> subsampling_xy;
    CHECK_MEM_ERROR(cm, mb->plane[plane].src_diff,
                    (int16_t *)aom_memalign(
                        32, sizeof(*mb->plane[plane].src_diff) * sb_size));
  }
}